

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O0

void __thiscall
cmVirtualDirectoryWatcher::~cmVirtualDirectoryWatcher(cmVirtualDirectoryWatcher *this)

{
  cmVirtualDirectoryWatcher *this_local;
  
  (this->super_cmIBaseWatcher)._vptr_cmIBaseWatcher =
       (_func_int **)&PTR__cmVirtualDirectoryWatcher_00cc5120;
  cmDeleteAll<std::unordered_map<std::__cxx11::string,cmIBaseWatcher*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmIBaseWatcher*>>>>
            (&this->Children);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmIBaseWatcher_*>_>_>
  ::~unordered_map(&this->Children);
  cmIBaseWatcher::~cmIBaseWatcher(&this->super_cmIBaseWatcher);
  return;
}

Assistant:

~cmVirtualDirectoryWatcher() override { cmDeleteAll(this->Children); }